

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

string * google::protobuf::internal::SubMessagePrefix
                   (string *__return_storage_ptr__,string *prefix,FieldDescriptor *field,int index)

{
  AlphaNum *a;
  string sStack_68;
  AlphaNum local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  if ((field->field_0x1 & 8) == 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (index != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_48,index);
    absl::lts_20240722::StrCat_abi_cxx11_(&sStack_68,(lts_20240722 *)&local_48,a);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(absl::StrCat(index));
    result.append("]");
  }
  result.append(".");
  return result;
}